

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GeneratePrivateMembers
          (StringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,"::std::string* $name$_;\n");
  if (*(long *)(*(long *)(this->descriptor_ + 0x70) + 8) != 0) {
    io::Printer::Print(printer,&this->variables_,"static ::std::string* $default_variable$;\n");
    return;
  }
  return;
}

Assistant:

void StringFieldGenerator::
GeneratePrivateMembers(io::Printer* printer) const {
  printer->Print(variables_, "::std::string* $name$_;\n");
  if (!descriptor_->default_value_string().empty()) {
    printer->Print(variables_, "static ::std::string* $default_variable$;\n");
  }
}